

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall node::~node(node *this)

{
  tensor *this_00;
  node *this_local;
  
  this->_vptr_node = (_func_int **)&PTR_forward_00114950;
  this->ret->hook = (node *)0x0;
  this_00 = this->ret;
  if (this_00 != (tensor *)0x0) {
    tensor::~tensor(this_00);
    operator_delete(this_00,0x20);
  }
  node_cnt = node_cnt + -1;
  std::vector<double,_std::allocator<double>_>::~vector(&this->grad_fn);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::~vector(&this->input);
  return;
}

Assistant:

virtual ~node(){
//        ret->cnt_free--; //记录被释放几次
//        cout<<ret->cnt_free<<" ";
        ret->hook=NULL;

//        if(ret->cnt_free<=0) //因为最后输出不会作为其他输入，所以可能有负数的情况
        delete ret;
        node_cnt--;
    }